

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

void read_all(Lexer *lexer)

{
  uint chr;
  CharBuff *buff;
  Token *data;
  
  buff = new_buff(10);
  do {
    chr = read_chr(lexer);
    if ((chr == 10) || (chr == 0xd)) {
      lexer->col_pos = 1;
      lexer->row_pos = lexer->row_pos + 1;
    }
    else if (chr == 0xc9) {
      recycle_buff(buff);
      return;
    }
    clear_buff(buff);
    data = generate_token(lexer,chr,buff);
    if (data->kind != EMPTY) {
      list_add(lexer->tokens,data);
    }
  } while( true );
}

Assistant:

void read_all(Lexer *lexer) {
    CharBuff *buff = new_buff(10);
    int chr;
    Token* token;
    while ((chr = read_chr(lexer)) != END) {
        if (is_new_line(chr)) {
            lexer->col_pos = 1;
            lexer->row_pos++;
        }
        clear_buff(buff);
        if ((token = generate_token(lexer, chr, buff))->kind == EMPTY)continue;
        list_add(lexer->tokens, token);
    }
    recycle_buff(buff);
}